

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

Vec_Str_t * Gia_ManIsoFindString(Gia_Man_t *p,int iPo,int fVerbose,Vec_Int_t **pvPiPerm)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vAnds_00;
  Vec_Int_t *vCos_00;
  Vec_Str_t *vStr;
  Vec_Int_t *vCos;
  Vec_Int_t *vAnds;
  Vec_Int_t *vCis;
  Vec_Ptr_t *vEquiv;
  Gia_Man_t *pPart;
  Vec_Int_t **pvPiPerm_local;
  int fVerbose_local;
  int iPo_local;
  Gia_Man_t *p_local;
  
  pPart = (Gia_Man_t *)pvPiPerm;
  pvPiPerm_local._0_4_ = fVerbose;
  pvPiPerm_local._4_4_ = iPo;
  _fVerbose_local = p;
  vEquiv = (Vec_Ptr_t *)Gia_ManDupCones(p,(int *)((long)&pvPiPerm_local + 4),1,1);
  iVar1 = Gia_ManPoNum((Gia_Man_t *)vEquiv);
  if (iVar1 != 1) {
    __assert_fail("Gia_ManPoNum(pPart) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso.c"
                  ,0x3ef,"Vec_Str_t *Gia_ManIsoFindString(Gia_Man_t *, int, int, Vec_Int_t **)");
  }
  iVar1 = Gia_ManCiNum((Gia_Man_t *)vEquiv);
  if (iVar1 == 0) {
    iVar1 = Gia_ManPoNum((Gia_Man_t *)vEquiv);
    if (iVar1 != 1) {
      __assert_fail("Gia_ManPoNum(pPart) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso.c"
                    ,0x3f2,"Vec_Str_t *Gia_ManIsoFindString(Gia_Man_t *, int, int, Vec_Int_t **)");
    }
    iVar1 = Gia_ManObjNum((Gia_Man_t *)vEquiv);
    if (iVar1 != 2) {
      __assert_fail("Gia_ManObjNum(pPart) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso.c"
                    ,0x3f3,"Vec_Str_t *Gia_ManIsoFindString(Gia_Man_t *, int, int, Vec_Int_t **)");
    }
    pGVar2 = (Gia_Man_t *)Gia_AigerWriteIntoMemoryStr((Gia_Man_t *)vEquiv);
    Gia_ManStop((Gia_Man_t *)vEquiv);
    p_local = pGVar2;
    if (pPart != (Gia_Man_t *)0x0) {
      pVVar3 = Vec_IntAlloc(0);
      pPart->pName = (char *)pVVar3;
    }
  }
  else {
    vCis = (Vec_Int_t *)Gia_IsoDeriveEquivPos((Gia_Man_t *)vEquiv,0,(int)pvPiPerm_local);
    Vec_VecFreeP((Vec_Vec_t **)&vCis);
    iVar1 = Gia_ManCiNum((Gia_Man_t *)vEquiv);
    pVVar3 = Vec_IntAlloc(iVar1);
    iVar1 = Gia_ManAndNum((Gia_Man_t *)vEquiv);
    vAnds_00 = Vec_IntAlloc(iVar1);
    iVar1 = Gia_ManCoNum((Gia_Man_t *)vEquiv);
    vCos_00 = Vec_IntAlloc(iVar1);
    Gia_ManFindCaninicalOrder((Gia_Man_t *)vEquiv,pVVar3,vAnds_00,vCos_00,(Vec_Int_t **)pPart);
    p_00 = vEquiv;
    iVar1 = Gia_ManRegNum((Gia_Man_t *)vEquiv);
    pGVar2 = (Gia_Man_t *)
             Gia_AigerWriteIntoMemoryStrPart((Gia_Man_t *)p_00,pVVar3,vAnds_00,vCos_00,iVar1);
    Vec_IntFree(pVVar3);
    Vec_IntFree(vAnds_00);
    Vec_IntFree(vCos_00);
    Gia_ManStop((Gia_Man_t *)vEquiv);
    p_local = pGVar2;
  }
  return (Vec_Str_t *)p_local;
}

Assistant:

Vec_Str_t * Gia_ManIsoFindString( Gia_Man_t * p, int iPo, int fVerbose, Vec_Int_t ** pvPiPerm )
{
    Gia_Man_t * pPart;
    Vec_Ptr_t * vEquiv;
    Vec_Int_t * vCis, * vAnds, * vCos;
    Vec_Str_t * vStr;
    // duplicate
    pPart = Gia_ManDupCones( p, &iPo, 1, 1 );
//Gia_ManPrint( pPart );
    assert( Gia_ManPoNum(pPart) == 1 );
    if ( Gia_ManCiNum(pPart) == 0 ) // const AIG
    {
        assert( Gia_ManPoNum(pPart) == 1 );
        assert( Gia_ManObjNum(pPart) == 2 );
        vStr = Gia_AigerWriteIntoMemoryStr( pPart );
        Gia_ManStop( pPart );
        if ( pvPiPerm )
            *pvPiPerm = Vec_IntAlloc( 0 );
        return vStr;
    }
    // derive canonical values
    vEquiv = Gia_IsoDeriveEquivPos( pPart, 0, fVerbose );
    Vec_VecFreeP( (Vec_Vec_t **)&vEquiv );
    // find canonical order
    vCis  = Vec_IntAlloc( Gia_ManCiNum(pPart) );
    vAnds = Vec_IntAlloc( Gia_ManAndNum(pPart) );
    vCos  = Vec_IntAlloc( Gia_ManCoNum(pPart) );
    Gia_ManFindCaninicalOrder( pPart, vCis, vAnds, vCos, pvPiPerm );
//printf( "Internal: " );
//Vec_IntPrint( vCis );
    // derive the AIGER string
    vStr = Gia_AigerWriteIntoMemoryStrPart( pPart, vCis, vAnds, vCos, Gia_ManRegNum(pPart) );
    // cleanup
    Vec_IntFree( vCis );
    Vec_IntFree( vAnds );
    Vec_IntFree( vCos );
    Gia_ManStop( pPart );
    return vStr;
}